

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::incoming_suggest(peer_connection *this,piece_index_t index)

{
  vector<piece_index_t> *this_00;
  uint uVar1;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var2;
  pointer psVar3;
  pointer psVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  char *fmt;
  char *event;
  direction_t direction;
  ulong uVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  piece_index_t index_local;
  shared_ptr<libtorrent::aux::torrent> t;
  
  uVar8 = (ulong)(uint)index.m_val;
  index_local = index;
  peer_log(this,incoming_message,"SUGGEST_PIECE","piece: %d",uVar8);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
  if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    p_Var10 = (_List_node_base *)&this->m_extensions;
    do {
      p_Var10 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                   *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var10 == (_List_node_base *)&this->m_extensions) {
        iVar7 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
        if ((char)iVar7 != '\0') break;
        if (index.m_val < 0) {
          peer_log(this,incoming_message,"INVALID_SUGGEST_PIECE","%d",uVar8);
          break;
        }
        if (((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length < 1) {
LAB_00222a7f:
          psVar3 = (this->m_suggested_pieces).
                   super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          psVar4 = (this->m_suggested_pieces).
                   super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar7 = session_settings::get_int
                            ((this->super_peer_connection_hot_members).m_settings,0x4042);
          this_00 = &this->m_suggested_pieces;
          if (iVar7 < (int)((ulong)((long)psVar3 - (long)psVar4) >> 2)) {
            iVar7 = session_settings::get_int
                              ((this->super_peer_connection_hot_members).m_settings,0x4042);
            container_wrapper<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
            ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                                *)this_00,iVar7 + -1);
          }
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::insert(&this_00->
                    super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   ,(this_00->
                    super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ).
                    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,&index_local);
          uVar8 = (ulong)(uint)index_local.m_val;
          uVar9 = (ulong)((long)(this->m_suggested_pieces).
                                super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                .
                                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_suggested_pieces).
                               super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                               .
                               super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2;
          event = "SUGGEST_PIECE";
          fmt = "piece: %d added to set: %d";
          direction = info;
        }
        else {
          _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
               (this->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
               super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
          if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
              _Var2._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
            uVar9 = 0;
          }
          else {
            uVar1 = *(uint *)_Var2._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
            uVar9 = (ulong)uVar1;
            if (index.m_val < (int)uVar1) {
              bVar6 = torrent::have_piece(t.
                                          super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr,index);
              if (!bVar6) goto LAB_00222a7f;
              break;
            }
          }
          event = "INVALID_SUGGEST";
          fmt = "%d s: %d";
          direction = incoming_message;
        }
        peer_log(this,direction,event,fmt,uVar8,uVar9);
        break;
      }
      cVar5 = (**(code **)(*(long *)p_Var10[1]._M_next + 0xb0))();
    } while (cVar5 == '\0');
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void peer_connection::incoming_suggest(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "SUGGEST_PIECE"
			, "piece: %d", static_cast<int>(index));
#endif
		auto t = m_torrent.lock();
		if (!t) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_suggest(index)) return;
		}
#endif

		if (is_disconnecting()) return;
		if (index < piece_index_t(0))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "INVALID_SUGGEST_PIECE"
				, "%d", static_cast<int>(index));
#endif
			return;
		}

		if (t->valid_metadata())
		{
			if (index >= m_have_piece.end_index())
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "INVALID_SUGGEST"
					, "%d s: %d", static_cast<int>(index), m_have_piece.size());
#endif
				return;
			}

			// if we already have the piece, we can
			// ignore this message
			if (t->have_piece(index))
				return;
		}

		// the piece picker will prioritize the pieces from the beginning to end.
		// the later the suggestion is received, the higher priority we should
		// ascribe to it, so we need to insert suggestions at the front of the
		// queue.
		if (m_suggested_pieces.end_index() > m_settings.get_int(settings_pack::max_suggest_pieces))
			m_suggested_pieces.resize(m_settings.get_int(settings_pack::max_suggest_pieces) - 1);

		m_suggested_pieces.insert(m_suggested_pieces.begin(), index);

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::info, "SUGGEST_PIECE", "piece: %d added to set: %d"
			, static_cast<int>(index), m_suggested_pieces.end_index());
#endif
	}